

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.h
# Opt level: O2

void __thiscall ImageInput::~ImageInput(ImageInput *this)

{
  int in_ESI;
  
  this->_vptr_ImageInput = (_func_int **)&PTR__ImageInput_00244388;
  close(this,in_ESI);
  std::_Function_base::~_Function_base((_Function_base *)&this->sendWarning);
  Imageio::std::vector<ImageInput::imageInfo,_std::allocator<ImageInput::imageInfo>_>::~vector
            (&this->images);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&this->nativeBuffer8);
  Imageio::std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&this->nativeBuffer16)
  ;
  std::__cxx11::string::~string((string *)&this->_filename);
  std::__cxx11::string::~string((string *)&this->name);
  Imageio::std::
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&this->buffer);
  std::ifstream::~ifstream(&this->file);
  return;
}

Assistant:

virtual ~ImageInput() { close(); }